

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O2

Vec_Int_t * Gia_ManDfsForCrossCut(Gia_Man_t *p,int fReverse)

{
  Vec_Int_t *vNodes;
  Gia_Obj_t *pGVar1;
  int iVar2;
  
  Gia_ManCleanValue(p);
  vNodes = Vec_IntAlloc(p->nObjs);
  Gia_ManIncrementTravId(p);
  if (fReverse == 0) {
    for (iVar2 = 0; iVar2 < p->vCos->nSize; iVar2 = iVar2 + 1) {
      pGVar1 = Gia_ManCo(p,iVar2);
      if (pGVar1 == (Gia_Obj_t *)0x0) {
        return vNodes;
      }
      if ((~*(ulong *)(pGVar1 + -(ulong)((uint)*(undefined8 *)pGVar1 & 0x1fffffff)) &
          0x1fffffff1fffffff) != 0) {
        Gia_ManDfsForCrossCut_rec(p,pGVar1,vNodes);
      }
    }
  }
  else {
    iVar2 = p->vCos->nSize;
    while (0 < iVar2) {
      iVar2 = iVar2 + -1;
      pGVar1 = Gia_ManCo(p,iVar2);
      if (pGVar1 == (Gia_Obj_t *)0x0) {
        return vNodes;
      }
      if ((~*(ulong *)(pGVar1 + -(ulong)((uint)*(undefined8 *)pGVar1 & 0x1fffffff)) &
          0x1fffffff1fffffff) != 0) {
        Gia_ManDfsForCrossCut_rec(p,pGVar1,vNodes);
      }
    }
  }
  return vNodes;
}

Assistant:

Vec_Int_t * Gia_ManDfsForCrossCut( Gia_Man_t * p, int fReverse )
{
    Vec_Int_t * vNodes;
    Gia_Obj_t * pObj;
    int i;
    Gia_ManCleanValue( p );
    vNodes = Vec_IntAlloc( Gia_ManObjNum(p) );
    Gia_ManIncrementTravId( p );
    if ( fReverse )
    {
        Gia_ManForEachCoReverse( p, pObj, i )
            if ( !Gia_ObjIsConst0(Gia_ObjFanin0(pObj)) )
                Gia_ManDfsForCrossCut_rec( p, pObj, vNodes );
    }
    else
    {
        Gia_ManForEachCo( p, pObj, i )
            if ( !Gia_ObjIsConst0(Gia_ObjFanin0(pObj)) )
                Gia_ManDfsForCrossCut_rec( p, pObj, vNodes );
    }
    return vNodes;
}